

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

vector<YAML::Node,_std::allocator<YAML::Node>_> *
YAML::LoadAll(vector<YAML::Node,_std::allocator<YAML::Node>_> *__return_storage_ptr__,istream *input
             )

{
  bool bVar1;
  Parser parser;
  NodeBuilder builder;
  Parser local_e0;
  Node local_d0;
  NodeBuilder local_90;
  
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<YAML::Node,_std::allocator<YAML::Node>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::Parser(&local_e0,input);
  while( true ) {
    NodeBuilder::NodeBuilder(&local_90);
    bVar1 = Parser::HandleNextDocument(&local_e0,&local_90.super_EventHandler);
    if (!bVar1) break;
    NodeBuilder::Root(&local_d0,&local_90);
    std::vector<YAML::Node,_std::allocator<YAML::Node>_>::emplace_back<YAML::Node>
              (__return_storage_ptr__,&local_d0);
    Node::~Node(&local_d0);
    NodeBuilder::~NodeBuilder(&local_90);
  }
  NodeBuilder::~NodeBuilder(&local_90);
  Parser::~Parser(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> LoadAll(std::istream& input) {
  std::vector<Node> docs;

  Parser parser(input);
  while (true) {
    NodeBuilder builder;
    if (!parser.HandleNextDocument(builder)) {
      break;
    }
    docs.push_back(builder.Root());
  }

  return docs;
}